

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O0

_Bool randcalc_valid(random_value v,int test)

{
  int iVar1;
  int test_local;
  random_value v_local;
  
  iVar1 = randcalc(v,0,MINIMISE);
  if (test < iVar1) {
    v_local.sides._3_1_ = false;
  }
  else {
    iVar1 = randcalc(v,0,MAXIMISE);
    if (iVar1 < test) {
      v_local.sides._3_1_ = false;
    }
    else {
      v_local.sides._3_1_ = true;
    }
  }
  return v_local.sides._3_1_;
}

Assistant:

bool randcalc_valid(random_value v, int test)
{
	if (test < randcalc(v, 0, MINIMISE))
		return false;
	else if (test > randcalc(v, 0, MAXIMISE))
		return false;
	else
		return true;
}